

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall
dxil_spv::Converter::Impl::get_struct_type
          (Impl *this,Vector<spv::Id> *type_ids,TypeLayoutFlags flags,char *name)

{
  bool bVar1;
  Id IVar2;
  Builder *pBVar3;
  long lVar4;
  long lVar5;
  char *__s;
  __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
  _Var6;
  Vector<spv::Id> *__x;
  __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
  __it;
  TypeLayoutFlags flags_local;
  Vector<spv::Id> *local_b8;
  Id local_ac;
  StructTypeEntry *local_a8;
  Vector<StructTypeEntry> *local_a0;
  StructTypeEntry entry;
  char *name_local;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  entry.name._M_dataplus._M_p = (pointer)&flags_local;
  entry.name._M_string_length = (size_type)&name_local;
  local_a0 = &this->cached_struct_types;
  __it._M_current =
       (this->cached_struct_types).
       super__Vector_base<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (this->cached_struct_types).
             super__Vector_base<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_a8 - (long)__it._M_current;
  flags_local = flags;
  local_b8 = type_ids;
  entry._0_8_ = type_ids;
  name_local = name;
  for (lVar4 = lVar5 / 0x48 >> 2; __x = local_b8, _Var6._M_current = __it._M_current, 0 < lVar4;
      lVar4 = lVar4 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                          *)&entry,__it);
    __x = local_b8;
    if (bVar1) goto LAB_0010e3f4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                          *)&entry,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    __x = local_b8;
    if (bVar1) goto LAB_0010e3f4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                          *)&entry,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    __x = local_b8;
    if (bVar1) goto LAB_0010e3f4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                          *)&entry,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    __x = local_b8;
    if (bVar1) goto LAB_0010e3f4;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x120;
  }
  lVar5 = lVar5 / 0x48;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = local_a8;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
                  ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                                *)&entry,__it), _Var6._M_current = __it._M_current, bVar1))
      goto LAB_0010e3f4;
      _Var6._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                          *)&entry,_Var6);
    if (bVar1) goto LAB_0010e3f4;
    __it._M_current = _Var6._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
          ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                        *)&entry,__it);
  _Var6._M_current = local_a8;
  if (bVar1) {
    _Var6._M_current = __it._M_current;
  }
LAB_0010e3f4:
  if (_Var6._M_current ==
      (this->cached_struct_types).
      super__Vector_base<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    entry.name._M_dataplus._M_p = (pointer)&entry.name.field_2;
    entry.name._M_string_length = 0;
    entry.name.field_2._M_local_buf[0] = '\0';
    entry.subtypes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entry.subtypes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    entry.subtypes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator=
              (&entry.subtypes,__x);
    __s = "";
    if (name_local != (char *)0x0) {
      __s = name_local;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::assign(&entry.name,__s);
    if ((flags_local & 8) == 0) {
      pBVar3 = builder(this);
      IVar2 = spv::Builder::makeStructType(pBVar3,__x,entry.name._M_dataplus._M_p);
      entry.id = IVar2;
      if ((flags_local & 1) != 0) {
        decorate_physical_offsets(this,IVar2,__x);
      }
    }
    else {
      IVar2 = get_struct_type(this,__x,flags_local & 0xfffffff1,entry.name._M_dataplus._M_p);
      pBVar3 = builder(this);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_ac = IVar2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
                 &local_ac);
      IVar2 = spv::Builder::makeStructType
                        (pBVar3,(Vector<Id> *)&local_48,entry.name._M_dataplus._M_p);
      entry.id = IVar2;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 &local_48);
      pBVar3 = builder(this);
      spv::Builder::addDecoration(pBVar3,entry.id,DecorationBlock,-1);
      pBVar3 = builder(this);
      spv::Builder::addMemberDecoration(pBVar3,entry.id,0,DecorationOffset,0);
      if ((flags_local & 4) != 0) {
        pBVar3 = builder(this);
        spv::Builder::addMemberDecoration(pBVar3,entry.id,0,DecorationCoherent,-1);
      }
      if ((flags_local & 2) != 0) {
        pBVar3 = builder(this);
        spv::Builder::addMemberDecoration(pBVar3,entry.id,0,DecorationNonWritable,-1);
      }
      pBVar3 = builder(this);
      spv::Builder::addMemberName(pBVar3,entry.id,0,"data");
    }
    entry.flags = flags_local;
    IVar2 = entry.id;
    std::
    vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
    ::emplace_back<dxil_spv::Converter::Impl::StructTypeEntry>(local_a0,&entry);
    StructTypeEntry::~StructTypeEntry(&entry);
  }
  else {
    IVar2 = (_Var6._M_current)->id;
  }
  return IVar2;
}

Assistant:

spv::Id Converter::Impl::get_struct_type(const Vector<spv::Id> &type_ids, TypeLayoutFlags flags, const char *name)
{
	auto itr = std::find_if(cached_struct_types.begin(), cached_struct_types.end(), [&](const StructTypeEntry &entry) -> bool {
		if (type_ids.size() != entry.subtypes.size())
			return false;
		if (flags != entry.flags)
			return false;
		if ((!name && !entry.name.empty()) || (entry.name != name))
			return false;

		for (unsigned i = 0; i < type_ids.size(); i++)
			if (type_ids[i] != entry.subtypes[i])
				return false;

		return true;
	});

	if (itr == cached_struct_types.end())
	{
		StructTypeEntry entry;
		entry.subtypes = type_ids;
		entry.name = name ? name : "";

		if ((flags & TYPE_LAYOUT_BLOCK_BIT) != 0)
		{
			constexpr TypeLayoutFlags block_flags = TYPE_LAYOUT_BLOCK_BIT |
			                                        TYPE_LAYOUT_COHERENT_BIT |
			                                        TYPE_LAYOUT_READ_ONLY_BIT;
			spv::Id struct_type_id = get_struct_type(type_ids, flags & ~block_flags, entry.name.c_str());
			entry.id = builder().makeStructType({ struct_type_id }, entry.name.c_str());
			builder().addDecoration(entry.id, spv::DecorationBlock);
			builder().addMemberDecoration(entry.id, 0, spv::DecorationOffset, 0);
			if ((flags & TYPE_LAYOUT_COHERENT_BIT) != 0)
				builder().addMemberDecoration(entry.id, 0, spv::DecorationCoherent);
			if ((flags & TYPE_LAYOUT_READ_ONLY_BIT) != 0)
				builder().addMemberDecoration(entry.id, 0, spv::DecorationNonWritable);
			builder().addMemberName(entry.id, 0, "data");
		}
		else
		{
			entry.id = builder().makeStructType(type_ids, entry.name.c_str());
			if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
				decorate_physical_offsets(entry.id, type_ids);
		}

		entry.flags = flags;
		spv::Id id = entry.id;
		cached_struct_types.push_back(std::move(entry));
		return id;
	}
	else
		return itr->id;
}